

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_aggsig_sign_single
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,uchar *seckey32,uchar *secnonce32,
              uchar *extra32,secp256k1_pubkey *pubnonce_for_e,secp256k1_pubkey *pubnonce_total,
              secp256k1_pubkey *pubkey_for_e,uchar *seed)

{
  uchar *puVar1;
  int iVar2;
  secp256k1_scalar secnonce;
  secp256k1_scalar tmp_scalar;
  secp256k1_scalar sighash;
  secp256k1_ge tmp_ge;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_gej pubnonce_j;
  secp256k1_ge final;
  secp256k1_ge total_tmp_ge;
  int local_31c;
  uchar *local_318;
  uchar *local_310;
  int local_304;
  secp256k1_scalar local_300;
  secp256k1_scalar local_2e0;
  secp256k1_scalar local_2c0;
  secp256k1_scalar local_2a0;
  secp256k1_ge local_280;
  secp256k1_gej local_228;
  secp256k1_gej local_1a0;
  secp256k1_ge_storage local_120;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_aggsig_sign_single_cold_1();
LAB_00113765:
    iVar2 = 0;
  }
  else {
    local_318 = sig64;
    local_310 = msg32;
    if (secnonce32 == (uchar *)0x0) {
      secp256k1_rfc6979_hmac_sha256_initialize
                ((secp256k1_rfc6979_hmac_sha256 *)&local_228,seed,0x20);
      iVar2 = secp256k1_aggsig_generate_nonce_single
                        (ctx,&local_300,&local_1a0,(secp256k1_rfc6979_hmac_sha256 *)&local_228);
      if (iVar2 == 0) goto LAB_00113765;
      local_228.y.n[1] = 0;
      local_228.y.n[2] = 0;
      local_228.x.n[4] = 0;
      local_228.y.n[0] = 0;
      local_228.x.n[2] = 0;
      local_228.x.n[3] = 0;
      local_228.x.n[0] = 0;
      local_228.x.n[1] = 0;
      local_228.y.n[3] = (ulong)local_228.y.n[3]._4_4_ << 0x20;
      secp256k1_ge_set_gej(&local_280,&local_1a0);
    }
    else {
      secp256k1_scalar_set_b32(&local_300,secnonce32,&local_304);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_1a0,&local_300);
      secp256k1_ge_set_gej(&local_280,&local_1a0);
      if (pubnonce_total == (secp256k1_pubkey *)0x0) {
        iVar2 = secp256k1_gej_has_quad_y_var(&local_1a0);
        if (iVar2 == 0) {
          secp256k1_scalar_negate(&local_300,&local_300);
          secp256k1_gej_neg(&local_1a0,&local_1a0);
          secp256k1_ge_neg(&local_280,&local_280);
        }
      }
      else {
        local_228.infinity = 1;
        local_228.x.n[0] = 0;
        local_228.x.n[1] = 0;
        local_228.x.n[2] = 0;
        local_228.x.n[3] = 0;
        local_228.x.n[4] = 0;
        local_228.y.n[0] = 0;
        local_228.y.n[1] = 0;
        local_228.y.n[2] = 0;
        local_228.y.n[3] = 0;
        local_228.y.n[4] = 0;
        local_228.z.n[0] = 0;
        local_228.z.n[1] = 0;
        local_228.z.n[2] = 0;
        local_228.z.n[3] = 0;
        local_228.z.n[4] = 0;
        secp256k1_pubkey_load(ctx,&local_88,pubnonce_total);
        secp256k1_gej_add_ge(&local_228,&local_228,&local_88);
        iVar2 = secp256k1_gej_has_quad_y_var(&local_228);
        if (iVar2 == 0) {
          secp256k1_scalar_negate(&local_300,&local_300);
        }
      }
    }
    secp256k1_fe_normalize(&local_280.x);
    if (pubnonce_for_e == (secp256k1_pubkey *)0x0) {
      pubnonce_for_e = (secp256k1_pubkey *)&local_120;
      secp256k1_ge_to_storage((secp256k1_ge_storage *)pubnonce_for_e,&local_280);
    }
    secp256k1_compute_sighash_single(ctx,&local_2a0,pubnonce_for_e,pubkey_for_e,local_310);
    secp256k1_scalar_set_b32(&local_2e0,seckey32,&local_31c);
    iVar2 = 0;
    if (local_31c == 0) {
      secp256k1_scalar_mul(&local_2e0,&local_2e0,&local_2a0);
      secp256k1_scalar_add(&local_2e0,&local_2e0,&local_300);
      if (extra32 != (uchar *)0x0) {
        secp256k1_scalar_set_b32(&local_2c0,extra32,&local_31c);
        if (local_31c != 0) {
          return 0;
        }
        secp256k1_scalar_add(&local_2e0,&local_2e0,&local_2c0);
      }
      secp256k1_ge_set_gej(&local_e0,&local_1a0);
      secp256k1_fe_normalize_var(&local_e0.x);
      puVar1 = local_318;
      secp256k1_fe_get_b32(local_318,&local_e0.x);
      secp256k1_scalar_get_b32(puVar1 + 0x20,&local_2e0);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_aggsig_sign_single(const secp256k1_context* ctx,
    unsigned char *sig64,
    const unsigned char *msg32,
    const unsigned char *seckey32,
    const unsigned char* secnonce32,
    const unsigned char* extra32,
    const secp256k1_pubkey* pubnonce_for_e,
    const secp256k1_pubkey* pubnonce_total,
    const secp256k1_pubkey* pubkey_for_e,
    const unsigned char* seed){

    secp256k1_scalar sighash;
    secp256k1_rfc6979_hmac_sha256 rng;
    secp256k1_scalar sec;
    secp256k1_ge tmp_ge;
    secp256k1_ge total_tmp_ge;
    secp256k1_gej pubnonce_j;
    secp256k1_gej pubnonce_total_j;
    secp256k1_pubkey pub_tmp;

    secp256k1_scalar secnonce;
    secp256k1_ge final;
    int overflow;
    int retry;
    secp256k1_scalar tmp_scalar;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(seed != NULL);

    /* generate nonce if needed */
    if (secnonce32==NULL){
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, seed, 32);
        if (secp256k1_aggsig_generate_nonce_single(ctx, &secnonce, &pubnonce_j, &rng) == 0){
            return 0;
        }
        secp256k1_rfc6979_hmac_sha256_finalize(&rng);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);
    } else {
        secp256k1_scalar_set_b32(&secnonce, secnonce32, &retry);
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &pubnonce_j, &secnonce);
        secp256k1_ge_set_gej(&tmp_ge, &pubnonce_j);

        if (pubnonce_total!=NULL) {
            secp256k1_gej_set_infinity(&pubnonce_total_j);
            secp256k1_pubkey_load(ctx, &total_tmp_ge, pubnonce_total);
            secp256k1_gej_add_ge(&pubnonce_total_j, &pubnonce_total_j, &total_tmp_ge);
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_total_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
            }
        } else {
            if (!secp256k1_gej_has_quad_y_var(&pubnonce_j)) {
                secp256k1_scalar_negate(&secnonce, &secnonce);
                secp256k1_gej_neg(&pubnonce_j, &pubnonce_j);
                secp256k1_ge_neg(&tmp_ge, &tmp_ge);
            }
        }
    }

    secp256k1_fe_normalize(&tmp_ge.x);

    /* compute signature hash (in the simple case just message+pubnonce+pubkey) */
    if (pubnonce_for_e != NULL) {
        secp256k1_compute_sighash_single(ctx, &sighash, pubnonce_for_e, pubkey_for_e, msg32);
    } else {
        secp256k1_pubkey_save(&pub_tmp, &tmp_ge);
        secp256k1_compute_sighash_single(ctx, &sighash, &pub_tmp, pubkey_for_e, msg32);
    }
    /* calculate signature */
    secp256k1_scalar_set_b32(&sec, seckey32, &overflow);
    if (overflow) {
        secp256k1_scalar_clear(&sec);
        return 0;
    }

    secp256k1_scalar_mul(&sec, &sec, &sighash);
    secp256k1_scalar_add(&sec, &sec, &secnonce);

    if (extra32 != NULL) {
        /* add extra scalar */
        secp256k1_scalar_set_b32(&tmp_scalar, extra32, &overflow);
        if (overflow) {
            secp256k1_scalar_clear(&sec);
            return 0;
        }
        secp256k1_scalar_add(&sec, &sec, &tmp_scalar);
    }

    /* finalize */
    secp256k1_ge_set_gej(&final, &pubnonce_j);
    secp256k1_fe_normalize_var(&final.x);
    secp256k1_fe_get_b32(sig64, &final.x);
    secp256k1_scalar_get_b32(sig64 + 32, &sec);

    secp256k1_scalar_clear(&sec);

    return 1;
}